

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::BoolField::BoolField(BoolField *this,int field,bool data)

{
  undefined7 in_register_00000011;
  string sStack_38;
  
  BoolConvertor::convert_abi_cxx11_
            (&sStack_38,(BoolConvertor *)(CONCAT71(in_register_00000011,data) & 0xffffffff),data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_002f8538;
  return;
}

Assistant:

explicit BoolField(int field, bool data)
      : FieldBase(field, BoolConvertor::convert(data)) {}